

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O3

void Iex_3_4::handleExceptionsSetInRegisters(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uVar4;
  ushort in_FPUControlWord;
  ushort in_FPUStatusWord;
  uint16_t cw;
  uint16_t sw;
  uint32_t mxcsr;
  uint32_t mxcsr_1;
  
  if ((anonymous_namespace)::fpeHandler != (code *)0x0) {
    uVar1 = MXCSR >> 7 & (uint)in_FPUControlWord;
    uVar2 = in_FPUStatusWord | MXCSR;
    if (((uVar1 & 4) == 0) && ((uVar2 & 4) != 0)) {
      pcVar3 = "Floating-point division by zero.";
      uVar4 = 4;
    }
    else if (((uVar1 & 8) == 0) && ((uVar2 & 8) != 0)) {
      pcVar3 = "Floating-point overflow.";
      uVar4 = 1;
    }
    else if (((uVar1 & 0x10) == 0) && ((uVar2 & 0x10) != 0)) {
      pcVar3 = "Floating-point underflow.";
      uVar4 = 2;
    }
    else if (((uVar1 & 0x3f) < 0x20) && ((uVar2 & 0x20) != 0)) {
      pcVar3 = "Inexact floating-point result.";
      uVar4 = 8;
    }
    else {
      if ((uVar1 & 1) != 0) {
        return;
      }
      if ((uVar2 & 1) == 0) {
        return;
      }
      pcVar3 = "Invalid floating-point operation.";
      uVar4 = 0x10;
    }
    (*(anonymous_namespace)::fpeHandler)(uVar4,pcVar3);
  }
  return;
}

Assistant:

void
handleExceptionsSetInRegisters ()
{
    if (fpeHandler == 0) return;

    int mask = FpuControl::getExceptionMask ();

    int exc = FpuControl::getExceptions ();

    if (!(mask & FpuControl::DIVZERO_EXC) && (exc & FpuControl::DIVZERO_EXC))
    {
        fpeHandler (IEEE_DIVZERO, "Floating-point division by zero.");
        return;
    }

    if (!(mask & FpuControl::OVERFLOW_EXC) && (exc & FpuControl::OVERFLOW_EXC))
    {
        fpeHandler (IEEE_OVERFLOW, "Floating-point overflow.");
        return;
    }

    if (!(mask & FpuControl::UNDERFLOW_EXC) &&
        (exc & FpuControl::UNDERFLOW_EXC))
    {
        fpeHandler (IEEE_UNDERFLOW, "Floating-point underflow.");
        return;
    }

    if (!(mask & FpuControl::INEXACT_EXC) && (exc & FpuControl::INEXACT_EXC))
    {
        fpeHandler (IEEE_INEXACT, "Inexact floating-point result.");
        return;
    }

    if (!(mask & FpuControl::INVALID_EXC) && (exc & FpuControl::INVALID_EXC))
    {
        fpeHandler (IEEE_INVALID, "Invalid floating-point operation.");
        return;
    }
}